

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackZIPGenerator.cxx
# Opt level: O0

void __thiscall cmCPackZIPGenerator::cmCPackZIPGenerator(cmCPackZIPGenerator *this)

{
  allocator local_31;
  string local_30;
  cmCPackZIPGenerator *local_10;
  cmCPackZIPGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"zip",&local_31);
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressNone,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackZIPGenerator_00b16a18;
  return;
}

Assistant:

cmCPackZIPGenerator::cmCPackZIPGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressNone,
                           "zip")
{
}